

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexReport.cpp
# Opt level: O0

void reportSimplexPhaseIterations
               (HighsLogOptions *log_options,HighsInt iteration_count,HighsSimplexInfo *info,
               bool initialise)

{
  ostream *poVar1;
  undefined8 uVar2;
  byte in_CL;
  long in_RDX;
  int in_ESI;
  HighsLogOptions *in_RDI;
  stringstream iteration_report;
  HighsInt check_delta_iteration_count;
  HighsInt delta_primal_bound_swap;
  HighsInt delta_primal_phase2_iteration_count;
  HighsInt delta_primal_phase1_iteration_count;
  HighsInt delta_dual_phase2_iteration_count;
  HighsInt delta_dual_phase1_iteration_count;
  HighsInt delta_iteration_count;
  string local_1f0 [48];
  stringstream local_1c0 [16];
  ostream local_1b0;
  uint local_38;
  int local_34;
  int local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  byte local_19;
  HighsLogOptions *local_8;
  
  local_19 = in_CL & 1;
  if ((*(byte *)(in_RDX + 0x368) & 1) == 0) {
    if (local_19 == 0) {
      local_20 = in_ESI - *(int *)(in_RDX + 0x3bc);
      local_24 = *(int *)(in_RDX + 0x3a8) - *(int *)(in_RDX + 0x3c0);
      local_28 = *(int *)(in_RDX + 0x3ac) - *(int *)(in_RDX + 0x3c4);
      local_2c = *(int *)(in_RDX + 0x3b0) - *(int *)(in_RDX + 0x3c8);
      local_30 = *(int *)(in_RDX + 0x3b4) - *(int *)(in_RDX + 0x3cc);
      local_34 = *(int *)(in_RDX + 0x3b8) - *(int *)(in_RDX + 0x3d0);
      local_38 = local_24 + local_28 + local_2c + local_30;
      local_8 = in_RDI;
      if (local_38 != local_20) {
        highsLogUser(in_RDI,kError,"Iteration total error %d + %d + %d + %d = %d != %d\n",
                     (ulong)local_24,(ulong)local_28,(ulong)local_2c,local_30,local_38,local_20);
      }
      std::__cxx11::stringstream::stringstream(local_1c0);
      if (local_24 != 0) {
        poVar1 = std::operator<<(&local_1b0,"DuPh1 ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
        std::operator<<(poVar1,"; ");
      }
      if (local_28 != 0) {
        poVar1 = std::operator<<(&local_1b0,"DuPh2 ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
        std::operator<<(poVar1,"; ");
      }
      if (local_2c != 0) {
        poVar1 = std::operator<<(&local_1b0,"PrPh1 ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
        std::operator<<(poVar1,"; ");
      }
      if (local_30 != 0) {
        poVar1 = std::operator<<(&local_1b0,"PrPh2 ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
        std::operator<<(poVar1,"; ");
      }
      if (local_34 != 0) {
        poVar1 = std::operator<<(&local_1b0,"PrSwap ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_34);
        std::operator<<(poVar1,"; ");
      }
      std::__cxx11::stringstream::str();
      uVar2 = std::__cxx11::string::c_str();
      highsLogDev(local_8,kInfo,"Simplex iterations: %sTotal %d\n",uVar2,(ulong)local_20);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::stringstream::~stringstream(local_1c0);
    }
    else {
      *(int *)(in_RDX + 0x3bc) = in_ESI;
      *(undefined4 *)(in_RDX + 0x3c0) = *(undefined4 *)(in_RDX + 0x3a8);
      *(undefined4 *)(in_RDX + 0x3c4) = *(undefined4 *)(in_RDX + 0x3ac);
      *(undefined4 *)(in_RDX + 0x3c8) = *(undefined4 *)(in_RDX + 0x3b0);
      *(undefined4 *)(in_RDX + 0x3cc) = *(undefined4 *)(in_RDX + 0x3b4);
      *(undefined4 *)(in_RDX + 0x3d0) = *(undefined4 *)(in_RDX + 0x3b8);
    }
  }
  return;
}

Assistant:

void reportSimplexPhaseIterations(const HighsLogOptions& log_options,
                                  const HighsInt iteration_count,
                                  HighsSimplexInfo& info,
                                  const bool initialise) {
  if (info.run_quiet) return;
  if (initialise) {
    info.iteration_count0 = iteration_count;
    info.dual_phase1_iteration_count0 = info.dual_phase1_iteration_count;
    info.dual_phase2_iteration_count0 = info.dual_phase2_iteration_count;
    info.primal_phase1_iteration_count0 = info.primal_phase1_iteration_count;
    info.primal_phase2_iteration_count0 = info.primal_phase2_iteration_count;
    info.primal_bound_swap0 = info.primal_bound_swap;
    return;
  }
  const HighsInt delta_iteration_count =
      iteration_count - info.iteration_count0;
  const HighsInt delta_dual_phase1_iteration_count =
      info.dual_phase1_iteration_count - info.dual_phase1_iteration_count0;
  const HighsInt delta_dual_phase2_iteration_count =
      info.dual_phase2_iteration_count - info.dual_phase2_iteration_count0;
  const HighsInt delta_primal_phase1_iteration_count =
      info.primal_phase1_iteration_count - info.primal_phase1_iteration_count0;
  const HighsInt delta_primal_phase2_iteration_count =
      info.primal_phase2_iteration_count - info.primal_phase2_iteration_count0;
  const HighsInt delta_primal_bound_swap =
      info.primal_bound_swap - info.primal_bound_swap0;

  HighsInt check_delta_iteration_count =
      delta_dual_phase1_iteration_count + delta_dual_phase2_iteration_count +
      delta_primal_phase1_iteration_count + delta_primal_phase2_iteration_count;
  if (check_delta_iteration_count != delta_iteration_count) {
    highsLogUser(
        log_options, HighsLogType::kError,
        "Iteration total error %" HIGHSINT_FORMAT " + %" HIGHSINT_FORMAT
        " + %" HIGHSINT_FORMAT " + %" HIGHSINT_FORMAT " = %" HIGHSINT_FORMAT
        " != %" HIGHSINT_FORMAT "\n",
        delta_dual_phase1_iteration_count, delta_dual_phase2_iteration_count,
        delta_primal_phase1_iteration_count,
        delta_primal_phase2_iteration_count, check_delta_iteration_count,
        delta_iteration_count);
  }
  std::stringstream iteration_report;
  if (delta_dual_phase1_iteration_count) {
    iteration_report << "DuPh1 " << delta_dual_phase1_iteration_count << "; ";
  }
  if (delta_dual_phase2_iteration_count) {
    iteration_report << "DuPh2 " << delta_dual_phase2_iteration_count << "; ";
  }
  if (delta_primal_phase1_iteration_count) {
    iteration_report << "PrPh1 " << delta_primal_phase1_iteration_count << "; ";
  }
  if (delta_primal_phase2_iteration_count) {
    iteration_report << "PrPh2 " << delta_primal_phase2_iteration_count << "; ";
  }
  if (delta_primal_bound_swap) {
    iteration_report << "PrSwap " << delta_primal_bound_swap << "; ";
  }

  highsLogDev(log_options, HighsLogType::kInfo,
              "Simplex iterations: %sTotal %" HIGHSINT_FORMAT "\n",
              iteration_report.str().c_str(), delta_iteration_count);
}